

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::init_progressive(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  coeff_buf *pcVar6;
  ulong uVar7;
  code *pcVar8;
  code *decode_block_func;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (this->m_comps_in_frame == 4) {
    stop_decoding(this,JPGD_UNSUPPORTED_COLORSPACE);
  }
  if (0 < this->m_comps_in_frame) {
    lVar10 = 0;
    do {
      pcVar6 = coeff_buf_open(this,this->m_comp_h_samp[lVar10] * this->m_max_mcus_per_row,
                              this->m_comp_v_samp[lVar10] * this->m_max_mcus_per_col,1,1);
      this->m_dc_coeffs[lVar10] = pcVar6;
      pcVar6 = coeff_buf_open(this,this->m_comp_h_samp[lVar10] * this->m_max_mcus_per_row,
                              this->m_comp_v_samp[lVar10] * this->m_max_mcus_per_col,8,8);
      this->m_ac_coeffs[lVar10] = pcVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->m_comps_in_frame);
  }
  uVar9 = 0;
  do {
    iVar5 = init_scan(this);
    if (iVar5 != 0) {
      iVar1 = this->m_spectral_start;
      iVar2 = this->m_spectral_end;
      if ((iVar2 < iVar1) || (0x3f < iVar2)) {
LAB_001dc2bf:
        stop_decoding(this,JPGD_BAD_SOS_SPECTRAL);
      }
      if (iVar1 == 0) {
        if (iVar2 != 0) goto LAB_001dc2bf;
      }
      else if (this->m_comps_in_scan != 1) goto LAB_001dc2bf;
      pcVar8 = decode_block_ac_first;
      decode_block_func = decode_block_dc_first;
      if (this->m_successive_high != 0) {
        pcVar8 = decode_block_ac_refine;
        decode_block_func = decode_block_dc_refine;
        if (this->m_successive_low != this->m_successive_high + -1) {
          stop_decoding(this,JPGD_BAD_SOS_SUCCESSIVE);
        }
      }
      if (iVar1 != 0) {
        decode_block_func = pcVar8;
      }
      decode_scan(this,decode_block_func);
      this->m_bits_left = 0x10;
      get_bits(this,0x10);
      get_bits(this,0x10);
      uVar9 = uVar9 + 1;
      if (1000 < uVar9) {
        stop_decoding(this,JPGD_TOO_MANY_SCANS);
      }
    }
    if (iVar5 == 0) {
      iVar5 = this->m_comps_in_frame;
      this->m_comps_in_scan = iVar5;
      auVar3 = _DAT_001fd370;
      if (0 < (long)iVar5) {
        lVar10 = (long)iVar5 + -1;
        auVar11._8_4_ = (int)lVar10;
        auVar11._0_8_ = lVar10;
        auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar7 = 0;
        auVar11 = auVar11 ^ _DAT_001fd370;
        auVar12 = _DAT_001fd5f0;
        do {
          auVar13 = auVar12 ^ auVar3;
          if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                      auVar11._4_4_ < auVar13._4_4_) & 1)) {
            this->m_comp_list[uVar7] = (int)uVar7;
          }
          if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
              auVar13._12_4_ <= auVar11._12_4_) {
            this->m_comp_list[uVar7 + 1] = (int)uVar7 + 1;
          }
          uVar7 = uVar7 + 2;
          lVar10 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar10 + 2;
        } while ((iVar5 + 1U & 0xfffffffe) != uVar7);
      }
      bVar4 = calc_mcu_block_order(this);
      if (!bVar4) {
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      return;
    }
  } while( true );
}

Assistant:

void jpeg_decoder::init_progressive()
	{
		int i;

		if (m_comps_in_frame == 4)
			stop_decoding(JPGD_UNSUPPORTED_COLORSPACE);

		// Allocate the coefficient buffers.
		for (i = 0; i < m_comps_in_frame; i++)
		{
			m_dc_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 1, 1);
			m_ac_coeffs[i] = coeff_buf_open(m_max_mcus_per_row * m_comp_h_samp[i], m_max_mcus_per_col * m_comp_v_samp[i], 8, 8);
		}

		// See https://libjpeg-turbo.org/pmwiki/uploads/About/TwoIssueswiththeJPEGStandard.pdf
		uint32_t total_scans = 0;
		const uint32_t MAX_SCANS_TO_PROCESS = 1000;

		for (; ; )
		{
			int dc_only_scan, refinement_scan;
			pDecode_block_func decode_block_func;

			if (!init_scan())
				break;

			dc_only_scan = (m_spectral_start == 0);
			refinement_scan = (m_successive_high != 0);

			if ((m_spectral_start > m_spectral_end) || (m_spectral_end > 63))
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if (dc_only_scan)
			{
				if (m_spectral_end)
					stop_decoding(JPGD_BAD_SOS_SPECTRAL);
			}
			else if (m_comps_in_scan != 1)  /* AC scans can only contain one component */
				stop_decoding(JPGD_BAD_SOS_SPECTRAL);

			if ((refinement_scan) && (m_successive_low != m_successive_high - 1))
				stop_decoding(JPGD_BAD_SOS_SUCCESSIVE);

			if (dc_only_scan)
			{
				if (refinement_scan)
					decode_block_func = decode_block_dc_refine;
				else
					decode_block_func = decode_block_dc_first;
			}
			else
			{
				if (refinement_scan)
					decode_block_func = decode_block_ac_refine;
				else
					decode_block_func = decode_block_ac_first;
			}

			decode_scan(decode_block_func);

			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			total_scans++;
			if (total_scans > MAX_SCANS_TO_PROCESS)
				stop_decoding(JPGD_TOO_MANY_SCANS);
		}

		m_comps_in_scan = m_comps_in_frame;

		for (i = 0; i < m_comps_in_frame; i++)
			m_comp_list[i] = i;

		if (!calc_mcu_block_order())
			stop_decoding(JPGD_DECODE_ERROR);
	}